

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void Catch::FatalConditionHandler::handleSignal(int sig)

{
  int iVar1;
  long lVar2;
  IMutableContext *pIVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined1 *local_40 [2];
  undefined1 local_30 [23];
  allocator<char> local_19;
  
  lVar2 = 8;
  do {
    if (*(int *)((long)&__dso_handle + lVar2) == sig) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_40,*(char **)((long)&signalDefs + lVar2),&local_19);
      pIVar3 = getCurrentMutableContext();
      iVar1 = (*(pIVar3->super_IContext)._vptr_IContext[2])(pIVar3);
      (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x50))
                ((long *)CONCAT44(extraout_var_00,iVar1),local_40);
      goto LAB_00150a83;
    }
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x68);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"<unknown signal>","");
  pIVar3 = getCurrentMutableContext();
  iVar1 = (*(pIVar3->super_IContext)._vptr_IContext[2])(pIVar3);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x50))
            ((long *)CONCAT44(extraout_var,iVar1),local_40);
LAB_00150a83:
  exit(-sig);
}

Assistant:

static void handleSignal( int sig ) {
            for( std::size_t i = 0; i < sizeof(signalDefs)/sizeof(SignalDefs); ++i )
                if( sig == signalDefs[i].id )
                    fatal( signalDefs[i].name, -sig );
            fatal( "<unknown signal>", -sig );
        }